

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemView::eventFilter(QAbstractItemView *this,QObject *object,QEvent *event)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  QAbstractItemViewPrivate *this_00;
  QWidget *pQVar4;
  QEvent *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QWidget *widget;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  QWidget *in_stack_ffffffffffffffd8;
  QAbstractScrollArea *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAbstractItemView *)0x811894);
  if (in_RSI != in_RDI) {
    pQVar4 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_RSI);
    if (in_RSI != pQVar4) {
      TVar3 = QEvent::type(in_RDX);
      if (TVar3 == FocusIn) {
        pQVar4 = qobject_cast<QWidget*>
                           ((QObject *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
                           );
        if (pQVar4 != (QWidget *)0x0) {
          bVar2 = QSet<QWidget_*>::contains
                            ((QSet<QWidget_*> *)in_RSI,
                             (QWidget **)
                             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
          if (bVar2) {
            QAbstractItemViewPrivate::indexForEditor(this_00,in_stack_ffffffffffffffd8);
            setCurrentIndex((QAbstractItemView *)this_00,(QModelIndex *)in_RDI);
            bVar2 = false;
            goto LAB_00811969;
          }
        }
        bVar2 = QAbstractScrollArea::eventFilter
                          (in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->super_QObject,
                           (QEvent *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
        goto LAB_00811969;
      }
    }
  }
  bVar2 = QAbstractScrollArea::eventFilter
                    (in_stack_ffffffffffffffe0,&in_stack_ffffffffffffffd8->super_QObject,
                     (QEvent *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
LAB_00811969:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemView::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QAbstractItemView);
    if (object == this || object == viewport() || event->type() != QEvent::FocusIn)
        return QAbstractScrollArea::eventFilter(object, event);
    QWidget *widget = qobject_cast<QWidget *>(object);
    // If it is not a persistent widget then we did not install
    // the event filter on it, so assume a base implementation is
    // filtering
    if (!widget || !d->persistent.contains(widget))
        return QAbstractScrollArea::eventFilter(object, event);
    setCurrentIndex(d->indexForEditor(widget));
    return false;
}